

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adjacency_graph.hpp
# Opt level: O0

void __thiscall Disa::Adjacency_Graph<false>::resize(Adjacency_Graph<false> *this,size_t *size)

{
  ulong uVar1;
  difference_type dVar2;
  bool bVar3;
  size_t sVar4;
  reference pvVar5;
  size_t sVar6;
  type *ptVar7;
  value_type local_b8;
  const_iterator local_90;
  const_iterator local_88;
  unsigned_long *local_80;
  unsigned_long *local_78;
  difference_type local_70;
  difference_type offset_current;
  unsigned_long *local_60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  erase_iter;
  type *adjacency_end;
  type *adjacency_begin;
  size_t local_30;
  size_t i_vertex;
  size_t offset_carry;
  ulong *local_18;
  size_t *size_local;
  Adjacency_Graph<false> *this_local;
  
  local_18 = size;
  size_local = (size_t *)this;
  sVar4 = size_vertex(this);
  if (sVar4 < *local_18) {
    uVar1 = *local_18;
    bVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(&this->offset);
    if (bVar3) {
      local_b8 = 0;
    }
    else {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->offset);
      local_b8 = *pvVar5;
    }
    offset_carry = local_b8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->offset,uVar1 + 1,&offset_carry);
  }
  else {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&this->offset,*local_18 + 1);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(&this->offset);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->vertex_adjacent_list,*pvVar5);
    i_vertex = 0;
    for (local_30 = 0; sVar4 = local_30, sVar6 = size_vertex(this), sVar4 < sVar6;
        local_30 = local_30 + 1) {
      _adjacency_begin = vertex_adjacency_iter(this,&local_30);
      ptVar7 = std::
               get<0ul,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                         ((pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)&adjacency_begin);
      erase_iter._M_current =
           (unsigned_long *)
           std::
           get<1ul,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                     ((pair<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,___gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&adjacency_begin);
      local_60 = ptVar7->_M_current;
      offset_current = (difference_type)((type *)erase_iter._M_current)->_M_current;
      local_58 = std::
                 lower_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                           (local_60,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      )offset_current,local_18);
      bVar3 = __gnu_cxx::
              operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        (&local_58,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)erase_iter._M_current);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        local_78 = local_58._M_current;
        local_80 = (unsigned_long *)*erase_iter._M_current;
        local_70 = std::
                   distance<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                             (local_58,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                        )local_80);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_88,&local_58);
        __gnu_cxx::
        __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
        ::__normal_iterator<unsigned_long*>
                  ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
                    *)&local_90,
                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)erase_iter._M_current);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                  (&this->vertex_adjacent_list,local_88,local_90);
        dVar2 = local_70;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&this->offset,local_30 + 1);
        *pvVar5 = *pvVar5 - dVar2;
        i_vertex = local_70 + i_vertex;
      }
      sVar4 = i_vertex;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->offset,local_30 + 2);
      *pvVar5 = *pvVar5 - sVar4;
    }
  }
  return;
}

Assistant:

void Adjacency_Graph<_directed>::resize(const std::size_t& size) {

  // Branch based on expansion or contraction of the graph.
  if(size_vertex() < size) {
    offset.resize(size + 1, offset.empty() ? 0 : offset.back());
  } else {
    // Resize the containers.
    offset.resize(size + 1);
    vertex_adjacent_list.resize(offset.back());

    // Loop over remaining vertices, looking for edges which no longer exist.
    std::size_t offset_carry = 0;
    FOR(i_vertex, size_vertex()) {
      auto [adjacency_begin, adjacency_end] = vertex_adjacency_iter(i_vertex);
      const auto erase_iter = std::lower_bound(adjacency_begin, adjacency_end, size);
      if(erase_iter != adjacency_end) {
        const auto offset_current = std::distance(erase_iter, adjacency_end);
        vertex_adjacent_list.erase(erase_iter, adjacency_end);
        offset[i_vertex + 1] -= offset_current;
        offset_carry += offset_current;
      }
      offset[i_vertex + 2] -= offset_carry;
    }
  }
}